

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr(lua_State *L,CTypeID id,GCstr *name)

{
  undefined1 local_258 [8];
  CTRepr ctr;
  global_State *g;
  GCstr *name_local;
  CTypeID id_local;
  lua_State *L_local;
  
  ctr.buf._504_8_ = (L->glref).ptr64;
  local_258 = (undefined1  [8])(ctr.buf + 0xf8);
  ctr.pe = *(char **)(ctr.buf._504_8_ + 0x180);
  ctr.L._4_4_ = 1;
  ctr.L._0_4_ = 0;
  ctr.pb = (char *)local_258;
  ctr.cts = (CTState *)L;
  if (name != (GCstr *)0x0) {
    ctype_prepstr((CTRepr *)local_258,(char *)(name + 1),name->len);
  }
  ctype_repr((CTRepr *)local_258,id);
  if (ctr.L._4_4_ == 0) {
    L_local = (lua_State *)lj_str_new(L,"?",1);
  }
  else {
    L_local = (lua_State *)lj_str_new(L,(char *)local_258,(long)ctr.pb - (long)local_258);
  }
  return (GCstr *)L_local;
}

Assistant:

GCstr *lj_ctype_repr(lua_State *L, CTypeID id, GCstr *name)
{
  global_State *g = G(L);
  CTRepr ctr;
  ctr.pb = ctr.pe = &ctr.buf[CTREPR_MAX/2];
  ctr.cts = ctype_ctsG(g);
  ctr.L = L;
  ctr.ok = 1;
  ctr.needsp = 0;
  if (name) ctype_prepstr(&ctr, strdata(name), name->len);
  ctype_repr(&ctr, id);
  if (LJ_UNLIKELY(!ctr.ok)) return lj_str_newlit(L, "?");
  return lj_str_new(L, ctr.pb, ctr.pe - ctr.pb);
}